

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Worker::Dequeue(Worker *this)

{
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  *this_00;
  size_t sVar1;
  Request *this_01;
  bool bVar2;
  CURLMcode err;
  size_type sVar3;
  EasyHandle *pEVar4;
  __uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> *this_02;
  CurlException *this_03;
  _Map_pointer ppuVar5;
  __uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> *p_Var6;
  ulong uVar7;
  long lVar8;
  _Elt_pointer __args;
  _Elt_pointer puVar9;
  __uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> *__u;
  _Elt_pointer local_120;
  iterator local_108;
  deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  tmp;
  string local_98;
  const_iterator local_78;
  const_iterator local_50;
  
  std::
  _Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
  ::_Deque_base(&tmp.
                 super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
               );
  std::mutex::lock(&this->mutex_);
  this_00 = &this->queue_;
  sVar3 = std::
          deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
          ::size(this_00);
  sVar1 = (this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar3 + sVar1 < 0x21) {
    std::
    deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
    ::_M_move_assign1(&tmp,this_00);
    bVar2 = false;
  }
  else {
    uVar7 = 0x20 - sVar1;
    sVar3 = std::
            deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
            ::size(this_00);
    if (sVar3 < uVar7) {
      uVar7 = sVar3;
    }
    if (uVar7 != 0) {
      __args = (this->queue_).
               super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      puVar9 = (this->queue_).
               super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppuVar5 = (this->queue_).
                super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_120 = (this->queue_).
                  super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_first;
      do {
        lVar8 = -uVar7;
        do {
          lVar8 = lVar8 + 1;
          if (lVar8 == 1) {
            local_78._M_cur =
                 (this->queue_).
                 super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
            local_78._M_first =
                 (this->queue_).
                 super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first;
            local_78._M_last =
                 (this->queue_).
                 super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
            local_78._M_node =
                 (this->queue_).
                 super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node;
            local_50._M_first = local_120;
            local_50._M_cur = __args;
            local_50._M_last = puVar9;
            local_50._M_node = ppuVar5;
            std::
            deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
            ::erase(&local_108,this_00,&local_78,&local_50);
            bVar2 = true;
            goto LAB_00129731;
          }
          if (__args == (this->queue_).
                        super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
            __assert_fail("it != queue_.end()",
                          "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                          ,0x37e,"void restincurl::Worker::Dequeue()");
          }
          std::
          deque<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::allocator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>
          ::
          emplace_back<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>
                    ((deque<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::allocator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>
                      *)&tmp,__args);
          __args = __args + 1;
        } while (__args != puVar9);
        __args = ppuVar5[1];
        ppuVar5 = ppuVar5 + 1;
        puVar9 = __args + 0x40;
        uVar7 = -lVar8;
        local_120 = __args;
      } while( true );
    }
    bVar2 = true;
    if ((this->ongoing_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0x20) {
      __assert_fail("ongoing_.size() == RESTINCURL_MAX_CONNECTIONS",
                    "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                    ,900,"void restincurl::Worker::Dequeue()");
    }
  }
LAB_00129731:
  this->pending_entries_in_queue_ = bVar2;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  local_120 = (_Elt_pointer)
              tmp.
              super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
  p_Var6 = (__uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
           tmp.
           super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  __u = (__uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
        tmp.
        super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur;
  while( true ) {
    if (__u == (__uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
               tmp.
               super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      std::
      deque<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
      ::~deque(&tmp);
      return;
    }
    this_01 = (__u->_M_t).
              super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>
              .super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
    if (this_01 == (Request *)0x0) break;
    pEVar4 = Request::GetEasyHandle(this_01);
    local_108._M_cur = (_Elt_pointer)pEVar4->handle_;
    this_02 = (__uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> *)
              std::
              map<void_*,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>_>
              ::operator[](&this->ongoing_,&local_108._M_cur);
    std::__uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>::operator=
              (this_02,__u);
    err = curl_multi_add_handle(this->handle_,pEVar4->handle_);
    if (err != CURLM_OK) {
      this_03 = (CurlException *)__cxa_allocate_exception(0x18);
      std::__cxx11::string::string
                ((string *)&local_98,"curl_multi_add_handle",(allocator *)&local_108);
      CurlException::CurlException(this_03,&local_98,err);
      __cxa_throw(this_03,&CurlException::typeinfo,std::runtime_error::~runtime_error);
    }
    __u = __u + 1;
    if (__u == p_Var6) {
      __u = *(__uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_> **)
             (local_120 + 1);
      local_120 = local_120 + 1;
      p_Var6 = __u + 0x40;
    }
  }
  __assert_fail("req",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x38d,"void restincurl::Worker::Dequeue()");
}

Assistant:

void Dequeue() {
            decltype(queue_) tmp;

            {
                lock_t lock(mutex_);
                if ((queue_.size() + ongoing_.size()) <= RESTINCURL_MAX_CONNECTIONS) {
                    tmp = std::move(queue_);
                    pending_entries_in_queue_ = false;
                } else {
                    auto remains = std::min<size_t>(RESTINCURL_MAX_CONNECTIONS - ongoing_.size(), queue_.size());
                    if (remains) {
                        auto it = queue_.begin();
                        RESTINCURL_LOG_TRACE("Adding only " << remains << " of " << queue_.size()
                            << " requests from queue: << RESTINCURL_MAX_CONNECTIONS=" << RESTINCURL_MAX_CONNECTIONS);
                        while(remains--) {
                            assert(it != queue_.end());
                            tmp.push_back(std::move(*it));
                            ++it;
                        }
                        queue_.erase(queue_.begin(), it);
                    } else {
                        assert(ongoing_.size() == RESTINCURL_MAX_CONNECTIONS);
                        RESTINCURL_LOG_TRACE("Adding no entries from queue: RESTINCURL_MAX_CONNECTIONS="
                            << RESTINCURL_MAX_CONNECTIONS);
                    }
                    pending_entries_in_queue_ = true;
                }
            }

            for(auto& req: tmp) {
                assert(req);
                const auto& eh = req->GetEasyHandle();
                RESTINCURL_LOG_TRACE("Adding request: " << eh);
                ongoing_[eh] = std::move(req);
                const auto mc = curl_multi_add_handle(handle_, eh);
                if (mc != CURLM_OK) {
                    throw CurlException("curl_multi_add_handle", mc);
                }
            }
        }